

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O3

void __thiscall
pugi::impl::anon_unknown_0::xpath_ast_node::
step_fill<pugi::impl::(anonymous_namespace)::axis_to_type<(pugi::impl::(anonymous_namespace)::axis_t)10>_>
          (xpath_ast_node *this,xml_node_struct *ns,xpath_allocator *n,undefined8 param_4,byte once)

{
  bool bVar1;
  xpath_allocator *pxVar2;
  xpath_allocator *alloc;
  
  pxVar2 = n;
  while (alloc = (xpath_allocator *)pxVar2[1]._error,
        ((xpath_allocator *)pxVar2[1]._error)[2]._root == (xpath_memory_block *)0x0) {
    pxVar2 = (xpath_allocator *)pxVar2[1]._root;
    if (pxVar2 == (xpath_allocator *)0x0) {
      return;
    }
  }
  while (alloc[1]._root_size != 0) {
    pxVar2 = *(xpath_allocator **)(alloc[1]._root_size + 0x28);
LAB_00346412:
    alloc = pxVar2;
    if (pxVar2 == (xpath_allocator *)0x0) {
      return;
    }
  }
  do {
    bVar1 = step_push((xpath_ast_node *)(ulong)(byte)this->_test,
                      (xpath_node_set_raw *)(this->_data).variable,ns,alloc);
    if ((bVar1 & once) != 0) {
      return;
    }
    do {
      pxVar2 = (xpath_allocator *)alloc[1]._error;
      if (pxVar2[2]._root != (xpath_memory_block *)0x0) goto LAB_00346412;
      alloc = (xpath_allocator *)alloc[1]._root;
      if (alloc == (xpath_allocator *)0x0) {
        return;
      }
      pxVar2 = n;
      if ((n != (xpath_allocator *)0x0) && (alloc != n)) {
        do {
          pxVar2 = (xpath_allocator *)pxVar2[1]._root;
          if (pxVar2 == (xpath_allocator *)0x0) break;
        } while (pxVar2 != alloc);
      }
    } while (pxVar2 == alloc);
  } while( true );
}

Assistant:

void step_fill(xpath_node_set_raw& ns, xml_node_struct* n, xpath_allocator* alloc, bool once, T)
		{
			const axis_t axis = T::axis;

			switch (axis)
			{
			case axis_attribute:
			{
				for (xml_attribute_struct* a = n->first_attribute; a; a = a->next_attribute)
					if (step_push(ns, a, n, alloc) & once)
						return;

				break;
			}

			case axis_child:
			{
				for (xml_node_struct* c = n->first_child; c; c = c->next_sibling)
					if (step_push(ns, c, alloc) & once)
						return;

				break;
			}

			case axis_descendant:
			case axis_descendant_or_self:
			{
				if (axis == axis_descendant_or_self)
					if (step_push(ns, n, alloc) & once)
						return;

				xml_node_struct* cur = n->first_child;

				while (cur)
				{
					if (step_push(ns, cur, alloc) & once)
						return;

					if (cur->first_child)
						cur = cur->first_child;
					else
					{
						while (!cur->next_sibling)
						{
							cur = cur->parent;

							if (cur == n) return;
						}

						cur = cur->next_sibling;
					}
				}

				break;
			}

			case axis_following_sibling:
			{
				for (xml_node_struct* c = n->next_sibling; c; c = c->next_sibling)
					if (step_push(ns, c, alloc) & once)
						return;

				break;
			}

			case axis_preceding_sibling:
			{
				for (xml_node_struct* c = n->prev_sibling_c; c->next_sibling; c = c->prev_sibling_c)
					if (step_push(ns, c, alloc) & once)
						return;

				break;
			}

			case axis_following:
			{
				xml_node_struct* cur = n;

				// exit from this node so that we don't include descendants
				while (!cur->next_sibling)
				{
					cur = cur->parent;

					if (!cur) return;
				}

				cur = cur->next_sibling;

				while (cur)
				{
					if (step_push(ns, cur, alloc) & once)
						return;

					if (cur->first_child)
						cur = cur->first_child;
					else
					{
						while (!cur->next_sibling)
						{
							cur = cur->parent;

							if (!cur) return;
						}

						cur = cur->next_sibling;
					}
				}

				break;
			}

			case axis_preceding:
			{
				xml_node_struct* cur = n;

				// exit from this node so that we don't include descendants
				while (!cur->prev_sibling_c->next_sibling)
				{
					cur = cur->parent;

					if (!cur) return;
				}

				cur = cur->prev_sibling_c;

				while (cur)
				{
					if (cur->first_child)
						cur = cur->first_child->prev_sibling_c;
					else
					{
						// leaf node, can't be ancestor
						if (step_push(ns, cur, alloc) & once)
							return;

						while (!cur->prev_sibling_c->next_sibling)
						{
							cur = cur->parent;

							if (!cur) return;

							if (!node_is_ancestor(cur, n))
								if (step_push(ns, cur, alloc) & once)
									return;
						}

						cur = cur->prev_sibling_c;
					}
				}

				break;
			}

			case axis_ancestor:
			case axis_ancestor_or_self:
			{
				if (axis == axis_ancestor_or_self)
					if (step_push(ns, n, alloc) & once)
						return;

				xml_node_struct* cur = n->parent;

				while (cur)
				{
					if (step_push(ns, cur, alloc) & once)
						return;

					cur = cur->parent;
				}

				break;
			}

			case axis_self:
			{
				step_push(ns, n, alloc);

				break;
			}

			case axis_parent:
			{
				if (n->parent)
					step_push(ns, n->parent, alloc);

				break;
			}

			default:
				assert(false && "Unimplemented axis"); // unreachable
			}
		}